

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

int __thiscall sptk::swipe::bisectiv(swipe *this,intvector yr_vector,int key)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  int hi;
  uint uVar4;
  
  uVar2 = (ulong)this & 0xffffffff;
  uVar4 = 1;
  while (uVar3 = uVar4, iVar1 = (int)uVar2, 1 < (int)(iVar1 - uVar3)) {
    uVar4 = (int)(iVar1 + uVar3) >> 1;
    if ((int)yr_vector.v < *(int *)(yr_vector._0_8_ + (long)(int)uVar4 * 4)) {
      uVar2 = (ulong)uVar4;
      uVar4 = uVar3;
    }
  }
  return iVar1;
}

Assistant:

int bisectiv(intvector yr_vector, int key) {
    int md;
    int lo = 1;
    int hi = yr_vector.x;
    while (hi - lo > 1) {
        md = (hi + lo) >> 1;
        if (yr_vector.v[md] > key)
            hi = md;
        else
            lo = md;
    }
    return(hi);
}